

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepSetOptimalParams(void *arkode_mem)

{
  int iVar1;
  SUNAdaptController p_Var2;
  sunrealtype k1;
  SUNContext_conflict sunctx;
  long leniw;
  long lenrw;
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffa8;
  SUNContext_conflict in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  SUNAdaptController in_stack_ffffffffffffffc0;
  long local_38;
  int local_2c;
  ARKodeHAdaptMem local_28;
  long local_20;
  ARKodeMem local_18;
  int local_4;
  
  local_2c = arkStep_AccessARKODEStepMem
                       (in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8,(ARKodeARKStepMem *)0x1219e4);
  local_4 = local_2c;
  if (local_2c == 0) {
    if (local_18->hadapt_mem == (ARKodeHAdaptMem)0x0) {
      arkProcessError(local_18,-0x15,0x5ba,"ARKStepSetOptimalParams",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                      ,"Adaptivity memory structure not allocated.");
      local_4 = -0x15;
    }
    else {
      local_28 = local_18->hadapt_mem;
      local_2c = SUNAdaptController_Space(local_28->hcontroller,&local_38,&stack0xffffffffffffffc0);
      if (local_2c == 0) {
        local_18->liw = local_18->liw - (long)in_stack_ffffffffffffffc0;
        local_18->lrw = local_18->lrw - local_38;
      }
      if (local_28->owncontroller != 0) {
        local_2c = SUNAdaptController_Destroy(local_28->hcontroller);
        local_18->hadapt_mem->owncontroller = 0;
        if (local_2c != 0) {
          arkProcessError(local_18,-0x14,0x5cd,"ARKStepSetOptimalParams",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                          ,"SUNAdaptController_Destroy failure");
          return -0x14;
        }
        local_2c = 0;
      }
      local_28->hcontroller = (SUNAdaptController)0x0;
      if ((*(int *)(local_20 + 0x1c) == 0) || (*(int *)(local_20 + 0x20) != 0)) {
        if ((*(int *)(local_20 + 0x20) == 0) || (*(int *)(local_20 + 0x1c) != 0)) {
          sunctx = (SUNContext_conflict)(ulong)(*(int *)(local_20 + 0x60) - 2);
          switch(sunctx) {
          case (SUNContext_conflict)0x0:
            p_Var2 = SUNAdaptController_PID(sunctx);
            local_28->hcontroller = p_Var2;
            if (local_28->hcontroller == (SUNAdaptController)0x0) {
              arkProcessError(local_18,-0x14,0x659,"ARKStepSetOptimalParams",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                              ,"SUNAdaptController_PID allocation failure");
              return -0x14;
            }
            local_28->safety = 0.9;
            local_28->growth = 20.0;
            local_28->etamxf = 0.3;
            local_28->small_nef = 2;
            local_28->etacf = 0.25;
            local_28->pq = 0;
            *(undefined8 *)(local_20 + 0xf0) = 0x3f50624dd2f1a9fc;
            *(undefined4 *)(local_20 + 0x108) = 5;
            *(undefined8 *)(local_20 + 200) = 0x3fd3333333333333;
            *(undefined8 *)(local_20 + 0xd0) = 0x4002666666666666;
            *(undefined8 *)(local_20 + 0xb8) = 0x3fc999999999999a;
            *(undefined4 *)(local_20 + 0xf8) = 0x14;
            break;
          case (SUNContext_conflict)0x1:
            p_Var2 = SUNAdaptController_PID(sunctx);
            local_28->hcontroller = p_Var2;
            if (local_28->hcontroller == (SUNAdaptController)0x0) {
              arkProcessError(local_18,-0x14,0x66e,"ARKStepSetOptimalParams",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                              ,"SUNAdaptController_PID allocation failure");
              return -0x14;
            }
            SUNAdaptController_SetErrorBias(0x3ff6b851eb851eb8,local_28->hcontroller);
            SUNAdaptController_SetParams_PID
                      (in_stack_ffffffffffffffc0,(sunrealtype)in_stack_ffffffffffffffb8,
                       (sunrealtype)sunctx,(sunrealtype)in_stack_ffffffffffffffa8);
            local_28->safety = 0.965;
            local_28->growth = 28.7;
            local_28->etamxf = 0.46;
            local_28->small_nef = 2;
            local_28->etacf = 0.25;
            local_28->pq = 0;
            *(undefined8 *)(local_20 + 0xf0) = 0x3fcc28f5c28f5c29;
            *(undefined8 *)(local_20 + 200) = 0x3fc5c28f5c28f5c3;
            *(undefined8 *)(local_20 + 0xd0) = 0x4002666666666666;
            *(undefined8 *)(local_20 + 0xb8) = 0x3fc851eb851eb852;
            *(undefined4 *)(local_20 + 0xf8) = 0x3c;
            break;
          case (SUNContext_conflict)0x2:
            p_Var2 = SUNAdaptController_PID(sunctx);
            local_28->hcontroller = p_Var2;
            if (local_28->hcontroller == (SUNAdaptController)0x0) {
              arkProcessError(local_18,-0x14,0x687,"ARKStepSetOptimalParams",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                              ,"SUNAdaptController_PID allocation failure");
              return -0x14;
            }
            SUNAdaptController_SetErrorBias(0x3ff599999999999a,local_28->hcontroller);
            SUNAdaptController_SetParams_PID
                      (in_stack_ffffffffffffffc0,(sunrealtype)in_stack_ffffffffffffffb8,
                       (sunrealtype)sunctx,(sunrealtype)in_stack_ffffffffffffffa8);
            local_28->safety = 0.97;
            local_28->growth = 25.0;
            local_28->etamxf = 0.47;
            local_28->small_nef = 2;
            local_28->etacf = 0.25;
            local_28->pq = 0;
            *(undefined8 *)(local_20 + 0xf0) = 0x3fceb851eb851eb8;
            *(undefined8 *)(local_20 + 200) = 0x3fd0a3d70a3d70a4;
            *(undefined8 *)(local_20 + 0xd0) = 0x4002666666666666;
            *(undefined8 *)(local_20 + 0xb8) = 0x3fc47ae147ae147b;
            *(undefined4 *)(local_20 + 0xf8) = 0x1f;
            break;
          case (SUNContext_conflict)0x3:
            p_Var2 = SUNAdaptController_PI(sunctx);
            local_28->hcontroller = p_Var2;
            if (local_28->hcontroller == (SUNAdaptController)0x0) {
              arkProcessError(local_18,-0x14,0x6a1,"ARKStepSetOptimalParams",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                              ,"SUNAdaptController_PI allocation failure");
              return -0x14;
            }
            SUNAdaptController_SetErrorBias(0x3ff2666666666666,local_28->hcontroller);
            SUNAdaptController_SetParams_PI
                      (in_stack_ffffffffffffffc0,(sunrealtype)in_stack_ffffffffffffffb8,
                       (sunrealtype)sunctx);
            local_28->safety = 0.993;
            local_28->growth = 28.5;
            local_28->etamxf = 0.3;
            local_28->small_nef = 2;
            local_28->etacf = 0.25;
            local_28->pq = 0;
            *(undefined8 *)(local_20 + 0xf0) = 0x3fd0000000000000;
            *(undefined8 *)(local_20 + 200) = 0x3fd999999999999a;
            *(undefined8 *)(local_20 + 0xd0) = 0x4002666666666666;
            *(undefined8 *)(local_20 + 0xb8) = 0x3fd47ae147ae147b;
            *(undefined4 *)(local_20 + 0xf8) = 0x1f;
          }
          local_28->owncontroller = 1;
          iVar1 = SUNAdaptController_Space(local_28->hcontroller,&local_38,&stack0xffffffffffffffc0)
          ;
          if (iVar1 == 0) {
            local_18->liw = (long)&in_stack_ffffffffffffffc0->content + local_18->liw;
            local_18->lrw = local_38 + local_18->lrw;
          }
        }
        else {
          k1 = (sunrealtype)(ulong)(*(int *)(local_20 + 0x60) - 2);
          switch(k1) {
          case 0.0:
            p_Var2 = SUNAdaptController_PID(in_stack_ffffffffffffffb0);
            local_28->hcontroller = p_Var2;
            if (local_28->hcontroller == (SUNAdaptController)0x0) {
              arkProcessError(local_18,-0x14,0x5f3,"ARKStepSetOptimalParams",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                              ,"SUNAdaptController_PID allocation failure");
              return -0x14;
            }
            local_28->safety = 0.9;
            local_28->growth = 20.0;
            local_28->etamxf = 0.3;
            local_28->small_nef = 2;
            local_28->etacf = 0.25;
            local_28->pq = 0;
            *(undefined8 *)(local_20 + 0xf0) = 0x3f50624dd2f1a9fc;
            *(undefined4 *)(local_20 + 0x108) = 5;
            *(undefined8 *)(local_20 + 200) = 0x3fd3333333333333;
            *(undefined8 *)(local_20 + 0xd0) = 0x4002666666666666;
            *(undefined8 *)(local_20 + 0xb8) = 0x3fc999999999999a;
            *(undefined4 *)(local_20 + 0xf8) = 0x14;
            break;
          case 4.94065645841247e-324:
            p_Var2 = SUNAdaptController_I(in_stack_ffffffffffffffb0);
            local_28->hcontroller = p_Var2;
            if (local_28->hcontroller == (SUNAdaptController)0x0) {
              arkProcessError(local_18,-0x14,0x608,"ARKStepSetOptimalParams",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                              ,"SUNAdaptController_I allocation failure");
              return -0x14;
            }
            SUNAdaptController_SetErrorBias(0x3ffe666666666666,local_28->hcontroller);
            local_28->safety = 0.957;
            local_28->growth = 17.6;
            local_28->etamxf = 0.45;
            local_28->small_nef = 2;
            local_28->etacf = 0.25;
            local_28->pq = 0;
            *(undefined8 *)(local_20 + 0xf0) = 0x3fcc28f5c28f5c29;
            *(undefined8 *)(local_20 + 200) = 0x3fc5c28f5c28f5c3;
            *(undefined8 *)(local_20 + 0xd0) = 0x4002666666666666;
            *(undefined8 *)(local_20 + 0xb8) = 0x3fc851eb851eb852;
            *(undefined4 *)(local_20 + 0xf8) = 0x3c;
            break;
          case 9.88131291682493e-324:
            p_Var2 = SUNAdaptController_PID(in_stack_ffffffffffffffb0);
            local_28->hcontroller = p_Var2;
            if (local_28->hcontroller == (SUNAdaptController)0x0) {
              arkProcessError(local_18,-0x14,0x61e,"ARKStepSetOptimalParams",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                              ,"SUNAdaptController_PID allocation failure");
              return -0x14;
            }
            SUNAdaptController_SetErrorBias(0x3ff3333333333333,local_28->hcontroller);
            SUNAdaptController_SetParams_PID
                      (in_stack_ffffffffffffffc0,k1,(sunrealtype)in_stack_ffffffffffffffb0,
                       (sunrealtype)in_stack_ffffffffffffffa8);
            local_28->safety = 0.988;
            local_28->growth = 31.5;
            local_28->etamxf = 0.33;
            local_28->small_nef = 2;
            local_28->etacf = 0.25;
            local_28->pq = 0;
            *(undefined8 *)(local_20 + 0xf0) = 0x3fceb851eb851eb8;
            *(undefined8 *)(local_20 + 200) = 0x3fd0a3d70a3d70a4;
            *(undefined8 *)(local_20 + 0xd0) = 0x4002666666666666;
            *(undefined8 *)(local_20 + 0xb8) = 0x3fc47ae147ae147b;
            *(undefined4 *)(local_20 + 0xf8) = 0x1f;
            break;
          case 1.48219693752374e-323:
            p_Var2 = SUNAdaptController_PID(in_stack_ffffffffffffffb0);
            local_28->hcontroller = p_Var2;
            if (local_28->hcontroller == (SUNAdaptController)0x0) {
              arkProcessError(local_18,-0x14,0x638,"ARKStepSetOptimalParams",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                              ,"SUNAdaptController_PID allocation failure");
              return -0x14;
            }
            SUNAdaptController_SetErrorBias(0x400a666666666666,local_28->hcontroller);
            SUNAdaptController_SetParams_PID
                      (in_stack_ffffffffffffffc0,k1,(sunrealtype)in_stack_ffffffffffffffb0,
                       (sunrealtype)in_stack_ffffffffffffffa8);
            local_28->safety = 0.937;
            local_28->growth = 22.0;
            local_28->etamxf = 0.44;
            local_28->small_nef = 2;
            local_28->etacf = 0.25;
            local_28->pq = 0;
            *(undefined8 *)(local_20 + 0xf0) = 0x3fd0000000000000;
            *(undefined8 *)(local_20 + 200) = 0x3fd999999999999a;
            *(undefined8 *)(local_20 + 0xd0) = 0x4002666666666666;
            *(undefined8 *)(local_20 + 0xb8) = 0x3fd47ae147ae147b;
            *(undefined4 *)(local_20 + 0xf8) = 0x1f;
          }
        }
      }
      else {
        p_Var2 = SUNAdaptController_PI(in_stack_ffffffffffffffb0);
        local_28->hcontroller = p_Var2;
        if (local_28->hcontroller == (SUNAdaptController)0x0) {
          arkProcessError(local_18,-0x14,0x5dc,"ARKStepSetOptimalParams",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                          ,"SUNAdaptController_PI allocation failure");
          return -0x14;
        }
        SUNAdaptController_SetErrorBias(0x3ff3333333333333,local_28->hcontroller);
        SUNAdaptController_SetParams_PI
                  (in_stack_ffffffffffffffc0,(sunrealtype)in_stack_ffffffffffffffb8,
                   (sunrealtype)in_stack_ffffffffffffffb0);
        local_28->safety = 0.99;
        local_28->growth = 25.0;
        local_28->etamxf = 0.3;
        local_28->pq = 0;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKStepSetOptimalParams(void* arkode_mem)
{
  /* TODO: do we need to do something here? This is deprecated with no
   * ARKodeSetOptimalParams to replace it */
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  ARKodeHAdaptMem hadapt_mem;
  int retval;
  long int lenrw, leniw;

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* access ARKodeHAdaptMem structure */
  if (ark_mem->hadapt_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKADAPT_NO_MEM);
    return (ARK_MEM_NULL);
  }
  hadapt_mem = ark_mem->hadapt_mem;

  /* Remove current SUNAdaptController object */
  retval = SUNAdaptController_Space(hadapt_mem->hcontroller, &lenrw, &leniw);
  if (retval == SUN_SUCCESS)
  {
    ark_mem->liw -= leniw;
    ark_mem->lrw -= lenrw;
  }
  if (hadapt_mem->owncontroller)
  {
    retval = SUNAdaptController_Destroy(hadapt_mem->hcontroller);
    ark_mem->hadapt_mem->owncontroller = SUNFALSE;
    if (retval != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_Destroy failure");
      return (ARK_MEM_FAIL);
    }
  }
  hadapt_mem->hcontroller = NULL;

  /* Choose values based on method, order */

  /*    explicit */
  if (step_mem->explicit && !step_mem->implicit)
  {
    hadapt_mem->hcontroller = SUNAdaptController_PI(ark_mem->sunctx);
    if (hadapt_mem->hcontroller == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_PI allocation failure");
      return (ARK_MEM_FAIL);
    }
    (void)SUNAdaptController_SetErrorBias(hadapt_mem->hcontroller,
                                          SUN_RCONST(1.2));
    (void)SUNAdaptController_SetParams_PI(hadapt_mem->hcontroller,
                                          SUN_RCONST(0.8), -SUN_RCONST(0.31));
    hadapt_mem->safety = SUN_RCONST(0.99);
    hadapt_mem->growth = SUN_RCONST(25.0);
    hadapt_mem->etamxf = SUN_RCONST(0.3);
    hadapt_mem->pq     = PQ;

    /*    implicit */
  }
  else if (step_mem->implicit && !step_mem->explicit)
  {
    switch (step_mem->q)
    {
    case 2: /* just use standard defaults since better ones unknown */
      hadapt_mem->hcontroller = SUNAdaptController_PID(ark_mem->sunctx);
      if (hadapt_mem->hcontroller == NULL)
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        "SUNAdaptController_PID allocation failure");
        return (ARK_MEM_FAIL);
      }
      hadapt_mem->safety    = SAFETY;
      hadapt_mem->growth    = GROWTH;
      hadapt_mem->etamxf    = ETAMXF;
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      hadapt_mem->pq        = PQ;
      step_mem->nlscoef     = SUN_RCONST(0.001);
      step_mem->maxcor      = 5;
      step_mem->crdown      = CRDOWN;
      step_mem->rdiv        = RDIV;
      step_mem->dgmax       = DGMAX;
      step_mem->msbp        = MSBP;
      break;
    case 3:
      hadapt_mem->hcontroller = SUNAdaptController_I(ark_mem->sunctx);
      if (hadapt_mem->hcontroller == NULL)
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        "SUNAdaptController_I allocation failure");
        return (ARK_MEM_FAIL);
      }
      (void)SUNAdaptController_SetErrorBias(hadapt_mem->hcontroller,
                                            SUN_RCONST(1.9));
      hadapt_mem->safety    = SUN_RCONST(0.957);
      hadapt_mem->growth    = SUN_RCONST(17.6);
      hadapt_mem->etamxf    = SUN_RCONST(0.45);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      hadapt_mem->pq        = PQ;
      step_mem->nlscoef     = SUN_RCONST(0.22);
      step_mem->crdown      = SUN_RCONST(0.17);
      step_mem->rdiv        = SUN_RCONST(2.3);
      step_mem->dgmax       = SUN_RCONST(0.19);
      step_mem->msbp        = 60;
      break;
    case 4:
      hadapt_mem->hcontroller = SUNAdaptController_PID(ark_mem->sunctx);
      if (hadapt_mem->hcontroller == NULL)
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        "SUNAdaptController_PID allocation failure");
        return (ARK_MEM_FAIL);
      }
      (void)SUNAdaptController_SetErrorBias(hadapt_mem->hcontroller,
                                            SUN_RCONST(1.2));
      (void)SUNAdaptController_SetParams_PID(hadapt_mem->hcontroller,
                                             SUN_RCONST(0.535),
                                             -SUN_RCONST(0.209),
                                             SUN_RCONST(0.148));
      hadapt_mem->safety    = SUN_RCONST(0.988);
      hadapt_mem->growth    = SUN_RCONST(31.5);
      hadapt_mem->etamxf    = SUN_RCONST(0.33);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      hadapt_mem->pq        = PQ;
      step_mem->nlscoef     = SUN_RCONST(0.24);
      step_mem->crdown      = SUN_RCONST(0.26);
      step_mem->rdiv        = SUN_RCONST(2.3);
      step_mem->dgmax       = SUN_RCONST(0.16);
      step_mem->msbp        = 31;
      break;
    case 5:
      hadapt_mem->hcontroller = SUNAdaptController_PID(ark_mem->sunctx);
      if (hadapt_mem->hcontroller == NULL)
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        "SUNAdaptController_PID allocation failure");
        return (ARK_MEM_FAIL);
      }
      (void)SUNAdaptController_SetErrorBias(hadapt_mem->hcontroller,
                                            SUN_RCONST(3.3));
      (void)SUNAdaptController_SetParams_PID(hadapt_mem->hcontroller,
                                             SUN_RCONST(0.56), -SUN_RCONST(0.338),
                                             SUN_RCONST(0.14));
      hadapt_mem->safety    = SUN_RCONST(0.937);
      hadapt_mem->growth    = SUN_RCONST(22.0);
      hadapt_mem->etamxf    = SUN_RCONST(0.44);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      hadapt_mem->pq        = PQ;
      step_mem->nlscoef     = SUN_RCONST(0.25);
      step_mem->crdown      = SUN_RCONST(0.4);
      step_mem->rdiv        = SUN_RCONST(2.3);
      step_mem->dgmax       = SUN_RCONST(0.32);
      step_mem->msbp        = 31;
      break;
    }

    /*    imex */
  }
  else
  {
    switch (step_mem->q)
    {
    case 2: /* just use standard defaults since better ones unknown */
      hadapt_mem->hcontroller = SUNAdaptController_PID(ark_mem->sunctx);
      if (hadapt_mem->hcontroller == NULL)
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        "SUNAdaptController_PID allocation failure");
        return (ARK_MEM_FAIL);
      }
      hadapt_mem->safety    = SAFETY;
      hadapt_mem->growth    = GROWTH;
      hadapt_mem->etamxf    = ETAMXF;
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      hadapt_mem->pq        = PQ;
      step_mem->nlscoef     = SUN_RCONST(0.001);
      step_mem->maxcor      = 5;
      step_mem->crdown      = CRDOWN;
      step_mem->rdiv        = RDIV;
      step_mem->dgmax       = DGMAX;
      step_mem->msbp        = MSBP;
      break;
    case 3:
      hadapt_mem->hcontroller = SUNAdaptController_PID(ark_mem->sunctx);
      if (hadapt_mem->hcontroller == NULL)
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        "SUNAdaptController_PID allocation failure");
        return (ARK_MEM_FAIL);
      }
      (void)SUNAdaptController_SetErrorBias(hadapt_mem->hcontroller,
                                            SUN_RCONST(1.42));
      (void)SUNAdaptController_SetParams_PID(hadapt_mem->hcontroller,
                                             SUN_RCONST(0.54), -SUN_RCONST(0.36),
                                             SUN_RCONST(0.14));
      hadapt_mem->safety    = SUN_RCONST(0.965);
      hadapt_mem->growth    = SUN_RCONST(28.7);
      hadapt_mem->etamxf    = SUN_RCONST(0.46);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      hadapt_mem->pq        = PQ;
      step_mem->nlscoef     = SUN_RCONST(0.22);
      step_mem->crdown      = SUN_RCONST(0.17);
      step_mem->rdiv        = SUN_RCONST(2.3);
      step_mem->dgmax       = SUN_RCONST(0.19);
      step_mem->msbp        = 60;
      break;
    case 4:
      hadapt_mem->hcontroller = SUNAdaptController_PID(ark_mem->sunctx);
      if (hadapt_mem->hcontroller == NULL)
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        "SUNAdaptController_PID allocation failure");
        return (ARK_MEM_FAIL);
      }
      (void)SUNAdaptController_SetErrorBias(hadapt_mem->hcontroller,
                                            SUN_RCONST(1.35));
      (void)SUNAdaptController_SetParams_PID(hadapt_mem->hcontroller,
                                             SUN_RCONST(0.543),
                                             -SUN_RCONST(0.297),
                                             SUN_RCONST(0.14));
      hadapt_mem->safety    = SUN_RCONST(0.97);
      hadapt_mem->growth    = SUN_RCONST(25.0);
      hadapt_mem->etamxf    = SUN_RCONST(0.47);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      hadapt_mem->pq        = PQ;
      step_mem->nlscoef     = SUN_RCONST(0.24);
      step_mem->crdown      = SUN_RCONST(0.26);
      step_mem->rdiv        = SUN_RCONST(2.3);
      step_mem->dgmax       = SUN_RCONST(0.16);
      step_mem->msbp        = 31;
      break;
    case 5:
      hadapt_mem->hcontroller = SUNAdaptController_PI(ark_mem->sunctx);
      if (hadapt_mem->hcontroller == NULL)
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        "SUNAdaptController_PI allocation failure");
        return (ARK_MEM_FAIL);
      }
      (void)SUNAdaptController_SetErrorBias(hadapt_mem->hcontroller,
                                            SUN_RCONST(1.15));
      (void)SUNAdaptController_SetParams_PI(hadapt_mem->hcontroller,
                                            SUN_RCONST(0.8), -SUN_RCONST(0.35));
      hadapt_mem->safety    = SUN_RCONST(0.993);
      hadapt_mem->growth    = SUN_RCONST(28.5);
      hadapt_mem->etamxf    = SUN_RCONST(0.3);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      hadapt_mem->pq        = PQ;
      step_mem->nlscoef     = SUN_RCONST(0.25);
      step_mem->crdown      = SUN_RCONST(0.4);
      step_mem->rdiv        = SUN_RCONST(2.3);
      step_mem->dgmax       = SUN_RCONST(0.32);
      step_mem->msbp        = 31;
      break;
    }
    hadapt_mem->owncontroller = SUNTRUE;

    retval = SUNAdaptController_Space(hadapt_mem->hcontroller, &lenrw, &leniw);
    if (retval == SUN_SUCCESS)
    {
      ark_mem->liw += leniw;
      ark_mem->lrw += lenrw;
    }
  }
  return (ARK_SUCCESS);
}